

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O2

void __thiscall CServerBrowser::LoadServerlist(CServerBrowser *this)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  char *pcVar4;
  json_value *this_00;
  _json_value *this_01;
  _json_value *p_Var5;
  uint i;
  uint uVar6;
  long in_FS_OFFSET;
  json_settings JsonSettings;
  NETADDR Addr;
  char aError [256];
  IOHANDLE io;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*(this->m_pStorage->super_IInterface)._vptr_IInterface[4])
                    (this->m_pStorage,"serverlist.json",1,0xffffffffffffffff,0,0,0,0);
  io = (IOHANDLE)CONCAT44(extraout_var,iVar2);
  if (io != (IOHANDLE)0x0) {
    lVar3 = io_length(io);
    uVar6 = (uint)lVar3;
    pcVar4 = (char *)mem_alloc(uVar6);
    io_read(io,pcVar4,uVar6);
    io_close(io);
    mem_zero(&JsonSettings,0x30);
    this_00 = json_parse_ex(&JsonSettings,pcVar4,(long)(int)uVar6,aError);
    mem_free(pcVar4);
    if (this_00 == (json_value *)0x0) {
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,1,"serverlist.json",aError,0);
    }
    else {
      this_01 = _json_value::operator[](this_00,"serverlist");
      for (uVar6 = 0; uVar6 < (this_01->u).string.length; uVar6 = uVar6 + 1) {
        p_Var5 = _json_value::operator[](this_01,uVar6);
        if (p_Var5->type == json_string) {
          Addr.type = 0;
          Addr.ip[0] = '\0';
          Addr.ip[1] = '\0';
          Addr.ip[2] = '\0';
          Addr.ip[3] = '\0';
          Addr.ip[4] = '\0';
          Addr.ip[5] = '\0';
          Addr.ip[6] = '\0';
          Addr.ip[7] = '\0';
          Addr.ip[8] = '\0';
          Addr.ip[9] = '\0';
          Addr.ip[10] = '\0';
          Addr.ip[0xb] = '\0';
          Addr.ip[0xc] = '\0';
          Addr.ip[0xd] = '\0';
          Addr.ip[0xe] = '\0';
          Addr.ip[0xf] = '\0';
          Addr.port = 0;
          Addr.reserved = 0;
          p_Var5 = _json_value::operator[](this_01,uVar6);
          pcVar4 = "";
          if (p_Var5->type == json_string) {
            pcVar4 = (p_Var5->u).string.ptr;
          }
          iVar2 = net_addr_from_str(&Addr,pcVar4);
          if (iVar2 == 0) {
            Set(this,&Addr,1,-1,(CServerInfo *)0x0);
          }
        }
      }
      json_value_free(this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServerBrowser::LoadServerlist()
{
	// read file data into buffer
	IOHANDLE File = Storage()->OpenFile(s_pFilename, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!File)
		return;
	int FileSize = (int)io_length(File);
	char *pFileData = (char *)mem_alloc(FileSize);
	io_read(File, pFileData, FileSize);
	io_close(File);

	// parse json data
	json_settings JsonSettings;
	mem_zero(&JsonSettings, sizeof(JsonSettings));
	char aError[256];
	json_value *pJsonData = json_parse_ex(&JsonSettings, pFileData, FileSize, aError);
	mem_free(pFileData);

	if(pJsonData == 0)
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, s_pFilename, aError);
		return;
	}

	// extract server list
	const json_value &rEntry = (*pJsonData)["serverlist"];
	for(unsigned i = 0; i < rEntry.u.array.length; ++i)
	{
		if(rEntry[i].type == json_string)
		{
			NETADDR Addr = { 0 };
			if(!net_addr_from_str(&Addr, rEntry[i]))
				Set(Addr, SET_MASTER_ADD, -1, 0);
		}
	}

	// clean up
	json_value_free(pJsonData);
}